

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::doAddRows(SPxLPBase<double> *this,LPRowSetBase<double> *set,bool scale)

{
  LPColSetBase<double> *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Nonzero<double> *pNVar5;
  Item *pIVar6;
  int *piVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  Nonzero<double> *pNVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  Item *pIVar17;
  double dVar18;
  DataArray<int> newCols;
  LPColBase<double> empty;
  DataArray<int> local_90;
  DataArray<int> *local_78;
  SPxLPBase<double> *local_70;
  LPColBase<double> local_68;
  
  DataArray<int>::DataArray
            (&local_90,(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,0,1.2);
  iVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  uVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  uVar9 = uVar2;
  if ((SPxLPBase<double> *)set != this) {
    LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,set);
    uVar9 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  }
  for (uVar10 = (ulong)uVar9; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
    local_90.data[uVar10 - 1] = 0;
  }
  uVar10 = (ulong)(uint)(set->super_SVSetBase<double>).set.thenum;
  this_00 = &this->super_LPColSetBase<double>;
  piVar7 = local_90.data;
  local_70 = this;
  while (0 < (int)uVar10) {
    uVar10 = uVar10 - 1;
    pIVar17 = (set->super_SVSetBase<double>).set.theitem;
    iVar12 = (set->super_SVSetBase<double>).set.thekey[uVar10].idx;
    uVar15 = (ulong)(uint)pIVar17[iVar12].data.super_SVectorBase<double>.memused;
    while (0 < (int)uVar15) {
      iVar3 = pIVar17[iVar12].data.super_SVectorBase<double>.m_elem[uVar15 - 1].idx;
      if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar3) {
        LPColBase<double>::LPColBase(&local_68,0);
        DataArray<int>::reSize(&local_90,iVar3 + 1);
        for (lVar13 = (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
            lVar13 <= iVar3; lVar13 = lVar13 + 1) {
          local_90.data[lVar13] = 0;
          LPColSetBase<double>::add(this_00,&local_68);
        }
        DSVectorBase<double>::~DSVectorBase(&local_68.vec);
        piVar7 = local_90.data;
        this = local_70;
      }
      piVar7[iVar3] = piVar7[iVar3] + 1;
      uVar15 = uVar15 - 1;
    }
  }
  uVar9 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  while (0 < (int)uVar9) {
    uVar9 = uVar9 - 1;
    if (0 < local_90.data[uVar9]) {
      iVar12 = local_90.data[uVar9] +
               (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
               [(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar9].idx].
               data.super_SVectorBase<double>.memused;
      LPColSetBase<double>::xtend(this_00,uVar9,iVar12);
      (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
      [(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar9].idx].data.
      super_SVectorBase<double>.memused = iVar12;
    }
  }
  lVar13 = (long)(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_78 = &(this->super_LPColSetBase<double>).scaleExp;
  while (iVar1 < lVar13) {
    lVar13 = lVar13 + -1;
    pIVar17 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
              (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar13].idx;
    iVar12 = 0;
    if (scale) {
      iVar12 = (*this->lp_scaler->_vptr_SPxScaler[1])(this->lp_scaler,pIVar17,local_78);
      dVar18 = (this->super_LPRowSetBase<double>).right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar13];
      pdVar8 = (double *)infinity();
      if (dVar18 < *pdVar8) {
        dVar18 = ldexp((this->super_LPRowSetBase<double>).right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13],iVar12);
        (this->super_LPRowSetBase<double>).right.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar13] = dVar18;
      }
      dVar18 = (this->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar13];
      pdVar8 = (double *)infinity();
      if (-*pdVar8 < dVar18) {
        dVar18 = ldexp((this->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13],iVar12);
        (this->super_LPRowSetBase<double>).left.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar13] = dVar18;
      }
      dVar18 = ldexp((this->super_LPRowSetBase<double>).object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13],iVar12);
      (this->super_LPRowSetBase<double>).object.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar13] = dVar18;
      (this->super_LPRowSetBase<double>).scaleExp.data[lVar13] = iVar12;
    }
    uVar10 = (ulong)(uint)(pIVar17->data).super_SVectorBase<double>.memused;
    lVar16 = uVar10 << 4;
    for (; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
      pNVar5 = (pIVar17->data).super_SVectorBase<double>.m_elem;
      iVar3 = *(int *)((long)pNVar5 + lVar16 + -8);
      pIVar6 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar4 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar3].idx;
      lVar14 = (long)pIVar6[iVar4].data.super_SVectorBase<double>.memused -
               (long)local_90.data[iVar3];
      local_90.data[iVar3] = local_90.data[iVar3] + -1;
      pNVar11 = pIVar6[iVar4].data.super_SVectorBase<double>.m_elem;
      pNVar11[lVar14].idx = (int)lVar13;
      dVar18 = *(double *)((long)&pNVar5[-1].val + lVar16);
      if (scale) {
        dVar18 = ldexp(dVar18,(this->super_LPColSetBase<double>).scaleExp.data[iVar3] + iVar12);
        *(double *)((long)&(pIVar17->data).super_SVectorBase<double>.m_elem[-1].val + lVar16) =
             dVar18;
        pNVar11 = pIVar6[iVar4].data.super_SVectorBase<double>.m_elem;
      }
      pNVar11[lVar14].val = dVar18;
      lVar16 = lVar16 + -0x10;
    }
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar1));
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum -
                         uVar2));
  DataArray<int>::~DataArray(&local_90);
  return;
}

Assistant:

void doAddRows(const LPRowSetBase<R>& set, bool scale = false)
   {
      int i, j, k, ii, idx;
      SVectorBase<R>* col;
      DataArray < int > newCols(nCols());
      int oldRowNumber = nRows();
      int oldColNumber = nCols();

      if(&set != this)
         LPRowSetBase<R>::add(set);

      assert(LPRowSetBase<R>::isConsistent());
      assert(LPColSetBase<R>::isConsistent());

      // count additional nonzeros per column
      for(i = nCols() - 1; i >= 0; --i)
         newCols[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.rowVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new columns if required
            ii = vec.index(j);

            if(ii >= nCols())
            {
               LPColBase<R> empty;
               newCols.reSize(ii + 1);

               for(k = nCols(); k <= ii; ++k)
               {
                  newCols[k] = 0;
                  LPColSetBase<R>::add(empty);
               }
            }

            assert(ii < nCols());
            newCols[ii]++;
         }
      }

      // extend columns as required (backward because of memory efficiency reasons)
      for(i = nCols() - 1; i >= 0; --i)
      {
         if(newCols[i] > 0)
         {
            int len = newCols[i] + colVector(i).size();
            LPColSetBase<R>::xtend(i, len);

            /* preset the sizes: beware that this can irritate a consistency check call from xtend(). We need to set the
             * sizes here, because a possible garbage collection called from xtend might destroy the sizes again. */
            colVector_w(i).set_size(len);
         }
      }

      // compute new row scaling factor and insert new elements to column file
      for(i = nRows() - 1; i >= oldRowNumber; --i)
      {
         SVectorBase<R>& vec = rowVector_w(i);
         int newRowScaleExp = 0;

         DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

         // compute new row scaling factor and apply it to the sides
         if(scale)
         {
            newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

            if(rhs(i) < R(infinity))
               rhs_w(i) = spxLdexp(rhs_w(i), newRowScaleExp);

            if(lhs(i) > R(-infinity))
               lhs_w(i) = spxLdexp(lhs_w(i), newRowScaleExp);

            maxRowObj_w(i) = spxLdexp(maxRowObj_w(i), newRowScaleExp);

            LPRowSetBase<R>::scaleExp[i] = newRowScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            k = vec.index(j);
            col = &colVector_w(k);
            idx = col->size() - newCols[k];
            assert(newCols[k] > 0);
            assert(idx >= 0);
            newCols[k]--;
            col->index(idx) = i;

            // apply new row and existing column scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[k]);

            col->value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nCols(); ++i)
         assert(newCols[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nRows() - oldRowNumber);
      addedRows(nRows() - oldRowNumber);
      addedCols(nCols() - oldColNumber);
   }